

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Add_patch(void *alpha,int g_a,int *alo,int *ahi,void *beta,int g_b,int *blo,int *bhi,
                  int g_c,int *clo,int *chi)

{
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  Integer *pIVar4;
  long lVar5;
  long lVar6;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  IVar1 = pnga_ndim((long)g_a);
  IVar2 = pnga_ndim((long)g_b);
  IVar3 = pnga_ndim((long)g_c);
  lVar6 = 0;
  lVar5 = 0;
  if (0 < IVar1) {
    lVar5 = IVar1;
  }
  pIVar4 = _ga_alo + IVar1 + -1;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = (long)alo[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pIVar4 = _ga_ahi + IVar1 + -1;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = (long)ahi[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  lVar6 = 0;
  lVar5 = 0;
  if (0 < IVar2) {
    lVar5 = IVar2;
  }
  pIVar4 = _ga_blo + IVar2 + -1;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = (long)blo[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pIVar4 = _ga_bhi + IVar2 + -1;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = (long)bhi[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  lVar6 = 0;
  lVar5 = 0;
  if (0 < IVar3) {
    lVar5 = IVar3;
  }
  pIVar4 = _ga_clo + IVar3 + -1;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = (long)clo[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pIVar4 = _ga_chi + IVar3 + -1;
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *pIVar4 = (long)chi[lVar6] + 1;
    pIVar4 = pIVar4 + -1;
  }
  pnga_add_patch(alpha,(long)g_a,_ga_alo,_ga_ahi,beta,(long)g_b,_ga_blo,_ga_bhi,(long)g_c,_ga_clo,
                 _ga_chi);
  return;
}

Assistant:

void NGA_Add_patch(void * alpha, int g_a, int alo[], int ahi[],
                   void * beta,  int g_b, int blo[], int bhi[],
                   int g_c, int clo[], int chi[])
{
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);

    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);

    Integer c=(Integer)g_c;
    Integer cndim = wnga_ndim(c);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];

    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);

    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);

    wnga_add_patch(alpha, a, _ga_alo, _ga_ahi, beta, b, _ga_blo, _ga_bhi,
                   c, _ga_clo, _ga_chi);
}